

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc.c
# Opt level: O0

void etdc_new_symbol(etdc_table **table,uint s)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  void *pvVar9;
  long lVar10;
  long *plVar11;
  undefined4 in_ESI;
  long *in_RDI;
  UT_hash_bucket *_he_newbkt;
  UT_hash_bucket *_he_new_buckets;
  UT_hash_handle *_he_hh_nxt;
  UT_hash_handle *_he_thh;
  uint _he_bkt_i;
  uint _he_bkt;
  char *_hj_key;
  uint _hj_k;
  uint _hj_j;
  uint _hj_i;
  uint _ha_bkt;
  etdc_table *e;
  int local_64;
  long local_40;
  uint local_38;
  char *local_30;
  uint local_28;
  uint local_24;
  uint local_20;
  
  pcVar8 = (char *)malloc(0x50);
  *(undefined4 *)pcVar8 = in_ESI;
  pcVar8[4] = '\x01';
  pcVar8[5] = '\0';
  pcVar8[6] = '\0';
  pcVar8[7] = '\0';
  pcVar8[0x28] = '\0';
  pcVar8[0x29] = '\0';
  pcVar8[0x2a] = '\0';
  pcVar8[0x2b] = '\0';
  pcVar8[0x2c] = '\0';
  pcVar8[0x2d] = '\0';
  pcVar8[0x2e] = '\0';
  pcVar8[0x2f] = '\0';
  *(char **)(pcVar8 + 0x40) = pcVar8;
  pcVar8[0x48] = '\x04';
  pcVar8[0x49] = '\0';
  pcVar8[0x4a] = '\0';
  pcVar8[0x4b] = '\0';
  if (*in_RDI == 0) {
    *in_RDI = (long)pcVar8;
    *(undefined8 *)(*in_RDI + 0x20) = 0;
    pvVar9 = malloc(0x40);
    *(void **)(*in_RDI + 0x18) = pvVar9;
    if (*(long *)(*in_RDI + 0x18) == 0) {
      exit(-1);
    }
    memset(*(void **)(*in_RDI + 0x18),0,0x40);
    *(long *)(*(long *)(*in_RDI + 0x18) + 0x18) = *in_RDI + 0x18;
    *(undefined4 *)(*(long *)(*in_RDI + 0x18) + 8) = 0x20;
    *(undefined4 *)(*(long *)(*in_RDI + 0x18) + 0xc) = 5;
    *(long *)(*(long *)(*in_RDI + 0x18) + 0x20) = (*in_RDI + 0x18) - *in_RDI;
    pvVar9 = malloc(0x200);
    **(undefined8 **)(*in_RDI + 0x18) = pvVar9;
    if (**(long **)(*in_RDI + 0x18) == 0) {
      exit(-1);
    }
    memset((void *)**(undefined8 **)(*in_RDI + 0x18),0,0x200);
    *(undefined4 *)(*(long *)(*in_RDI + 0x18) + 0x38) = 0xa0111fe1;
  }
  else {
    *(char **)(*(long *)(*(long *)(*in_RDI + 0x18) + 0x18) + 0x10) = pcVar8;
    *(long *)(pcVar8 + 0x20) =
         *(long *)(*(long *)(*in_RDI + 0x18) + 0x18) - *(long *)(*(long *)(*in_RDI + 0x18) + 0x20);
    *(char **)(*(long *)(*in_RDI + 0x18) + 0x18) = pcVar8 + 0x18;
  }
  *(int *)(*(long *)(*in_RDI + 0x18) + 0x10) = *(int *)(*(long *)(*in_RDI + 0x18) + 0x10) + 1;
  *(undefined8 *)(pcVar8 + 0x18) = *(undefined8 *)(*in_RDI + 0x18);
  pcVar8[0x4c] = -0x11;
  pcVar8[0x4d] = -0x42;
  pcVar8[0x4e] = -0x13;
  pcVar8[0x4f] = -2;
  local_24 = 0x9e3779b9;
  local_20 = 0x9e3779b9;
  local_30 = pcVar8;
  for (local_28 = 4; 0xb < local_28; local_28 = local_28 - 0xc) {
    cVar1 = *local_30;
    cVar2 = local_30[1];
    cVar3 = local_30[2];
    cVar4 = local_30[3];
    iVar5 = (int)local_30[4] + local_30[5] * 0x100 + local_30[6] * 0x10000 + local_30[7] * 0x1000000
            + local_24;
    *(int *)(pcVar8 + 0x4c) =
         (int)local_30[8] + local_30[9] * 0x100 + local_30[10] * 0x10000 + local_30[0xb] * 0x1000000
         + *(int *)(pcVar8 + 0x4c);
    uVar6 = *(uint *)(pcVar8 + 0x4c) >> 0xd ^
            (((int)cVar1 + cVar2 * 0x100 + cVar3 * 0x10000 + cVar4 * 0x1000000 + local_20) - iVar5)
            - *(int *)(pcVar8 + 0x4c);
    uVar7 = uVar6 << 8 ^ (iVar5 - *(int *)(pcVar8 + 0x4c)) - uVar6;
    *(uint *)(pcVar8 + 0x4c) = *(int *)(pcVar8 + 0x4c) - uVar6;
    *(uint *)(pcVar8 + 0x4c) = *(int *)(pcVar8 + 0x4c) - uVar7;
    *(uint *)(pcVar8 + 0x4c) = uVar7 >> 0xd ^ *(uint *)(pcVar8 + 0x4c);
    uVar6 = *(uint *)(pcVar8 + 0x4c) >> 0xc ^ (uVar6 - uVar7) - *(int *)(pcVar8 + 0x4c);
    uVar7 = uVar6 << 0x10 ^ (uVar7 - *(int *)(pcVar8 + 0x4c)) - uVar6;
    *(uint *)(pcVar8 + 0x4c) = *(int *)(pcVar8 + 0x4c) - uVar6;
    *(uint *)(pcVar8 + 0x4c) = *(int *)(pcVar8 + 0x4c) - uVar7;
    *(uint *)(pcVar8 + 0x4c) = uVar7 >> 5 ^ *(uint *)(pcVar8 + 0x4c);
    local_20 = *(uint *)(pcVar8 + 0x4c) >> 3 ^ (uVar6 - uVar7) - *(int *)(pcVar8 + 0x4c);
    local_24 = local_20 << 10 ^ (uVar7 - *(int *)(pcVar8 + 0x4c)) - local_20;
    *(uint *)(pcVar8 + 0x4c) = *(int *)(pcVar8 + 0x4c) - local_20;
    *(uint *)(pcVar8 + 0x4c) = *(int *)(pcVar8 + 0x4c) - local_24;
    *(uint *)(pcVar8 + 0x4c) = local_24 >> 0xf ^ *(uint *)(pcVar8 + 0x4c);
    local_30 = local_30 + 0xc;
  }
  *(int *)(pcVar8 + 0x4c) = *(int *)(pcVar8 + 0x4c) + 4;
  switch(local_28) {
  case 8:
    local_24 = (int)local_30[4] +
               local_30[5] * 0x100 + local_30[6] * 0x10000 + local_30[7] * 0x1000000 + local_24;
  case 4:
    local_20 = (int)*local_30 +
               local_30[1] * 0x100 + local_30[2] * 0x10000 + local_30[3] * 0x1000000 + local_20;
  }
  uVar6 = *(uint *)(pcVar8 + 0x4c) >> 0xd ^ (local_20 - local_24) - *(int *)(pcVar8 + 0x4c);
  uVar7 = uVar6 << 8 ^ (local_24 - *(int *)(pcVar8 + 0x4c)) - uVar6;
  *(uint *)(pcVar8 + 0x4c) = *(int *)(pcVar8 + 0x4c) - uVar6;
  *(uint *)(pcVar8 + 0x4c) = *(int *)(pcVar8 + 0x4c) - uVar7;
  *(uint *)(pcVar8 + 0x4c) = uVar7 >> 0xd ^ *(uint *)(pcVar8 + 0x4c);
  uVar6 = *(uint *)(pcVar8 + 0x4c) >> 0xc ^ (uVar6 - uVar7) - *(int *)(pcVar8 + 0x4c);
  uVar7 = uVar6 << 0x10 ^ (uVar7 - *(int *)(pcVar8 + 0x4c)) - uVar6;
  *(uint *)(pcVar8 + 0x4c) = *(int *)(pcVar8 + 0x4c) - uVar6;
  *(uint *)(pcVar8 + 0x4c) = *(int *)(pcVar8 + 0x4c) - uVar7;
  *(uint *)(pcVar8 + 0x4c) = uVar7 >> 5 ^ *(uint *)(pcVar8 + 0x4c);
  uVar6 = *(uint *)(pcVar8 + 0x4c) >> 3 ^ (uVar6 - uVar7) - *(int *)(pcVar8 + 0x4c);
  uVar7 = uVar6 << 10 ^ (uVar7 - *(int *)(pcVar8 + 0x4c)) - uVar6;
  *(uint *)(pcVar8 + 0x4c) = *(int *)(pcVar8 + 0x4c) - uVar6;
  *(uint *)(pcVar8 + 0x4c) = *(int *)(pcVar8 + 0x4c) - uVar7;
  *(uint *)(pcVar8 + 0x4c) = uVar7 >> 0xf ^ *(uint *)(pcVar8 + 0x4c);
  uVar6 = *(uint *)(pcVar8 + 0x4c) & *(int *)(*(long *)(*in_RDI + 0x18) + 8) - 1U;
  lVar10 = **(long **)(*in_RDI + 0x18) + (ulong)uVar6 * 0x10;
  *(int *)(lVar10 + 8) = *(int *)(lVar10 + 8) + 1;
  *(undefined8 *)(pcVar8 + 0x38) =
       *(undefined8 *)(**(long **)(*in_RDI + 0x18) + (ulong)uVar6 * 0x10);
  pcVar8[0x30] = '\0';
  pcVar8[0x31] = '\0';
  pcVar8[0x32] = '\0';
  pcVar8[0x33] = '\0';
  pcVar8[0x34] = '\0';
  pcVar8[0x35] = '\0';
  pcVar8[0x36] = '\0';
  pcVar8[0x37] = '\0';
  if (*(long *)(**(long **)(*in_RDI + 0x18) + (ulong)uVar6 * 0x10) != 0) {
    *(char **)(*(long *)(**(long **)(*in_RDI + 0x18) + (ulong)uVar6 * 0x10) + 0x18) = pcVar8 + 0x18;
  }
  *(char **)(**(long **)(*in_RDI + 0x18) + (ulong)uVar6 * 0x10) = pcVar8 + 0x18;
  if (((uint)((*(int *)(**(long **)(*in_RDI + 0x18) + (ulong)uVar6 * 0x10 + 0xc) + 1) * 10) <=
       *(uint *)(**(long **)(*in_RDI + 0x18) + (ulong)uVar6 * 0x10 + 8)) &&
     (*(int *)(*(long *)(pcVar8 + 0x18) + 0x34) != 1)) {
    pvVar9 = malloc((ulong)(uint)(*(int *)(*(long *)(pcVar8 + 0x18) + 8) << 1) << 4);
    if (pvVar9 == (void *)0x0) {
      exit(-1);
    }
    memset(pvVar9,0,(ulong)(uint)(*(int *)(*(long *)(pcVar8 + 0x18) + 8) << 1) << 4);
    *(uint *)(*(long *)(pcVar8 + 0x18) + 0x28) =
         (*(uint *)(*(long *)(pcVar8 + 0x18) + 0x10) >>
         ((char)*(undefined4 *)(*(long *)(pcVar8 + 0x18) + 0xc) + 1U & 0x1f)) +
         (uint)((*(uint *)(*(long *)(pcVar8 + 0x18) + 0x10) &
                *(int *)(*(long *)(pcVar8 + 0x18) + 8) * 2 - 1U) != 0);
    *(undefined4 *)(*(long *)(pcVar8 + 0x18) + 0x2c) = 0;
    for (local_38 = 0; local_38 < *(uint *)(*(long *)(pcVar8 + 0x18) + 8); local_38 = local_38 + 1)
    {
      local_40 = *(long *)(**(long **)(pcVar8 + 0x18) + (ulong)local_38 * 0x10);
      while (local_40 != 0) {
        lVar10 = *(long *)(local_40 + 0x20);
        plVar11 = (long *)((long)pvVar9 +
                          (ulong)(*(uint *)(local_40 + 0x34) &
                                 *(int *)(*(long *)(pcVar8 + 0x18) + 8) * 2 - 1U) * 0x10);
        uVar6 = (int)plVar11[1] + 1;
        *(uint *)(plVar11 + 1) = uVar6;
        if (*(uint *)(*(long *)(pcVar8 + 0x18) + 0x28) < uVar6) {
          *(int *)(*(long *)(pcVar8 + 0x18) + 0x2c) = *(int *)(*(long *)(pcVar8 + 0x18) + 0x2c) + 1;
          *(uint *)((long)plVar11 + 0xc) =
               *(uint *)(plVar11 + 1) / *(uint *)(*(long *)(pcVar8 + 0x18) + 0x28);
        }
        *(undefined8 *)(local_40 + 0x18) = 0;
        *(long *)(local_40 + 0x20) = *plVar11;
        if (*plVar11 != 0) {
          *(long *)(*plVar11 + 0x18) = local_40;
        }
        *plVar11 = local_40;
        local_40 = lVar10;
      }
    }
    free((void *)**(undefined8 **)(pcVar8 + 0x18));
    *(int *)(*(long *)(pcVar8 + 0x18) + 8) = *(int *)(*(long *)(pcVar8 + 0x18) + 8) << 1;
    *(int *)(*(long *)(pcVar8 + 0x18) + 0xc) = *(int *)(*(long *)(pcVar8 + 0x18) + 0xc) + 1;
    **(undefined8 **)(pcVar8 + 0x18) = pvVar9;
    if (*(uint *)(*(long *)(pcVar8 + 0x18) + 0x10) >> 1 < *(uint *)(*(long *)(pcVar8 + 0x18) + 0x2c)
       ) {
      local_64 = *(int *)(*(long *)(pcVar8 + 0x18) + 0x30) + 1;
    }
    else {
      local_64 = 0;
    }
    *(int *)(*(long *)(pcVar8 + 0x18) + 0x30) = local_64;
    if (1 < *(uint *)(*(long *)(pcVar8 + 0x18) + 0x30)) {
      *(undefined4 *)(*(long *)(pcVar8 + 0x18) + 0x34) = 1;
    }
  }
  return;
}

Assistant:

void etdc_new_symbol( struct etdc_table **table, unsigned int s) {
  struct etdc_table *e;
  
  e = (struct etdc_table *)malloc(sizeof(struct etdc_table));
  e->symbol = s;
  e->freq = 1;

  //fprintf(stderr, "Adding new symbol to etdc table");
  HASH_ADD_INT(*table, symbol, e);
}